

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# join_iterator.hpp
# Opt level: O3

void __thiscall
burst::detail::
join_iterator_impl<burst::owning_iterator<std::vector<boost::iterator_range<burst::variant_iterator<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_Deque_iterator<int,_int_&,_int_*>_>_>,_std::allocator<boost::iterator_range<burst::variant_iterator<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_Deque_iterator<int,_int_&,_int_*>_>_>_>_>_>,_boost::iterators::random_access_traversal_tag>
::maintain_invariant
          (join_iterator_impl<burst::owning_iterator<std::vector<boost::iterator_range<burst::variant_iterator<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_Deque_iterator<int,_int_&,_int_*>_>_>,_std::allocator<boost::iterator_range<burst::variant_iterator<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_Deque_iterator<int,_int_&,_int_*>_>_>_>_>_>,_boost::iterators::random_access_traversal_tag>
           *this)

{
  element_type *peVar1;
  iterator_range<burst::variant_iterator<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_Deque_iterator<int,_int_&,_int_*>_>_>
  *piVar2;
  result_type rVar3;
  iterator_range<burst::variant_iterator<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_Deque_iterator<int,_int_&,_int_*>_>_>
  *piVar4;
  anon_class_8_1_8991faa5 local_68;
  result_wrapper1<const_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_izvolov[P]burst_include_burst_iterator_variant_iterator_hpp:96:17)_&,_const_boost::variant<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_Deque_iterator<int,_int_&,_int_*>_>_&>
  local_60;
  variant<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_Deque_iterator<int,_int_&,_int_*>_>
  local_58;
  
  while( true ) {
    boost::
    variant<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_Deque_iterator<int,_int_&,_int_*>_>
    ::variant(&local_58,
              &(((this->m_outer).m_iterator._M_current)->
               super_iterator_range_base<burst::variant_iterator<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_Deque_iterator<int,_int_&,_int_*>_>,_boost::iterators::random_access_traversal_tag>
               ).
               super_iterator_range_base<burst::variant_iterator<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_Deque_iterator<int,_int_&,_int_*>_>,_boost::iterators::bidirectional_traversal_tag>
               .
               super_iterator_range_base<burst::variant_iterator<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_Deque_iterator<int,_int_&,_int_*>_>,_boost::iterators::incrementable_traversal_tag>
               .m_End.m_iterator);
    local_68.that =
         (variant_iterator<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_Deque_iterator<int,_int_&,_int_*>_>
          *)&local_58;
    local_60.visitor_ = &local_68;
    rVar3 = boost::
            variant<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,std::_Deque_iterator<int,int&,int*>>
            ::
            apply_visitor<boost::detail::variant::result_wrapper1<burst::variant_iterator<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,std::_Deque_iterator<int,int&,int*>>::equal(burst::variant_iterator<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,std::_Deque_iterator<int,int&,int*>>const&)const::_lambda(auto:1_const&)_1_const&,boost::variant<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,std::_Deque_iterator<int,int&,int*>>const&>>
                      ((variant<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,std::_Deque_iterator<int,int&,int*>>
                        *)&this->m_inner,&local_60);
    if (!rVar3) {
      boost::
      variant<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_Deque_iterator<int,_int_&,_int_*>_>
      ::destroy_content(&local_58);
      return;
    }
    peVar1 = (this->m_outer).m_container.
             super___shared_ptr<std::vector<boost::iterator_range<burst::variant_iterator<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_Deque_iterator<int,_int_&,_int_*>_>_>,_std::allocator<boost::iterator_range<burst::variant_iterator<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_Deque_iterator<int,_int_&,_int_*>_>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr;
    piVar4 = (this->m_outer).m_iterator._M_current + 1;
    (this->m_outer).m_iterator._M_current = piVar4;
    if (peVar1 != (this->m_end).m_container.
                  super___shared_ptr<std::vector<boost::iterator_range<burst::variant_iterator<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_Deque_iterator<int,_int_&,_int_*>_>_>,_std::allocator<boost::iterator_range<burst::variant_iterator<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_Deque_iterator<int,_int_&,_int_*>_>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_ptr) break;
    piVar2 = (this->m_end).m_iterator._M_current;
    boost::
    variant<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_Deque_iterator<int,_int_&,_int_*>_>
    ::destroy_content(&local_58);
    if (piVar4 == piVar2) {
      return;
    }
    boost::
    variant<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_Deque_iterator<int,_int_&,_int_*>_>
    ::variant(&local_58,
              (variant<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_Deque_iterator<int,_int_&,_int_*>_>
               *)(this->m_outer).m_iterator._M_current);
    boost::
    variant<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_Deque_iterator<int,_int_&,_int_*>_>
    ::variant_assign(&(this->m_inner).m_iterator,&local_58);
    boost::
    variant<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_Deque_iterator<int,_int_&,_int_*>_>
    ::destroy_content(&local_58);
  }
  __assert_fail("this->m_container == that.m_container",
                "/workspace/llm4binary/github/license_c_cmakelists/izvolov[P]burst/include/burst/iterator/owning_iterator.hpp"
                ,0x55,
                "bool burst::owning_iterator<std::vector<boost::iterator_range<burst::variant_iterator<__gnu_cxx::__normal_iterator<int *, std::vector<int>>, std::_Deque_iterator<int, int &, int *>>>>>::equal(const owning_iterator<Container> &) const [Container = std::vector<boost::iterator_range<burst::variant_iterator<__gnu_cxx::__normal_iterator<int *, std::vector<int>>, std::_Deque_iterator<int, int &, int *>>>>]"
               );
}

Assistant:

void maintain_invariant ()
            {
                while (m_inner == m_outer->end() &&
                    ++m_outer != m_end)
                {
                    m_inner = m_outer->begin();
                }
            }